

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O2

int Scl_CommandUpsize(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pAVar4;
  FILE *__s;
  char *pcVar5;
  char *pcVar6;
  size_t sStack_e0;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  SC_SizePars Pars;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Pars.nIters = 1000;
  Pars.nIterNoChange = 0x32;
  Pars.Window = 1;
  Pars.Ratio = 10;
  Pars.Notches = 1000;
  Pars.DelayUser = 0;
  Pars.DelayGap = 0;
  Pars.TimeOut = 0;
  Pars.BuffTreeEst = 0;
  Pars.BypassFreq = 0;
  Pars.fUseDept = 1;
  Pars.fUseWireLoads = 0;
  local_bc = 0;
  Extra_UtilGetoptReset();
  local_c0 = Pars.fUseDept;
  local_d0 = Pars.BypassFreq;
  local_cc = Pars.BuffTreeEst;
  local_c4 = Pars.DelayGap;
  local_c8 = Pars.TimeOut;
  local_64 = 0x32;
  local_58 = 10;
  local_50 = 1000;
  local_44 = 0;
  local_48 = 0;
  local_4c = 0;
  local_5c = 0;
  local_54 = 0;
  local_68 = 1000;
  local_6c = 1;
  local_78 = 0;
  local_74 = 0;
  local_70 = 0;
  local_60 = local_6c;
LAB_003879f4:
  iVar1 = Extra_UtilGetopt(argc,argv,"IJWRNDGTXBcsdvwh");
  iVar3 = globalUtilOptind;
  switch(iVar1) {
  case 0x42:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-B\" should be followed by a positive integer.\n";
      break;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_d0 = uVar2;
    local_44 = uVar2;
LAB_00387bdc:
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar2 < 0) {
switchD_00387a12_caseD_43:
      Pars.DelayGap = local_c4;
      Pars.fUseWireLoads = local_bc;
      Pars.fUseDept = local_c0;
      Pars.BypassFreq = local_d0;
      Pars.BuffTreeEst = local_cc;
      Pars.TimeOut = local_c8;
LAB_00387f7a:
      fwrite("usage: upsize [-IJWRNDGTXB num] [-csdvwh]\n",0x2a,1,(FILE *)pAbc->Err);
      fwrite("\t           selectively increases gate sizes on the critical path\n",0x42,1,
             (FILE *)pAbc->Err);
      fprintf((FILE *)pAbc->Err,
              "\t-I <num> : the number of upsizing iterations to perform [default = %d]\n",
              (ulong)local_68);
      fprintf((FILE *)pAbc->Err,
              "\t-J <num> : the number of iterations without improvement to stop [default = %d]\n",
              (ulong)local_64);
      fprintf((FILE *)pAbc->Err,
              "\t-W <num> : delay window (in percent) of near-critical COs [default = %d]\n",
              (ulong)local_60);
      fprintf((FILE *)pAbc->Err,
              "\t-R <num> : ratio of critical nodes (in percent) to update [default = %d]\n",
              (ulong)local_58);
      fprintf((FILE *)pAbc->Err,
              "\t-N <num> : limit on discrete upsizing steps at a node [default = %d]\n",
              (ulong)local_50);
      fprintf((FILE *)pAbc->Err,
              "\t-D <num> : delay target set by the user, in picoseconds [default = %d]\n",
              (ulong)local_54);
      fprintf((FILE *)pAbc->Err,
              "\t-G <num> : delay gap during updating, in picoseconds [default = %d]\n",
              (ulong)local_5c);
      fprintf((FILE *)pAbc->Err,"\t-T <num> : approximate timeout in seconds [default = %d]\n",
              (ulong)local_4c);
      fprintf((FILE *)pAbc->Err,"\t-X <num> : ratio for buffer tree estimation [default = %d]\n",
              (ulong)local_48);
      fprintf((FILE *)pAbc->Err,"\t-B <num> : frequency of bypass transforms [default = %d]\n",
              (ulong)local_44);
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (local_bc == 0) {
        pcVar5 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-c       : toggle using wire-loads if specified [default = %s]\n"
              ,pcVar5);
      pcVar5 = "yes";
      if (local_6c == 0) {
        pcVar5 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-s       : toggle using slack based on departure times [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_78 == 0) {
        pcVar5 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-d       : toggle dumping statistics into a file [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_74 == 0) {
        pcVar5 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-v       : toggle printing verbose information [default = %s]\n",
              pcVar5);
      if (local_70 == 0) {
        pcVar6 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-w       : toggle printing more verbose information [default = %s]\n",pcVar6);
      __s = (FILE *)pAbc->Err;
      pcVar5 = "\t-h       : print the command usage\n";
      sStack_e0 = 0x24;
LAB_00388152:
      fwrite(pcVar5,sStack_e0,1,__s);
      return 1;
    }
    goto LAB_003879f4;
  case 0x43:
  case 0x45:
  case 0x46:
  case 0x48:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x53:
  case 0x55:
  case 0x56:
    goto switchD_00387a12_caseD_43;
  case 0x44:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      Pars.DelayUser = uVar2;
      local_54 = uVar2;
      goto LAB_00387bdc;
    }
    pcVar5 = "Command line switch \"-D\" should be followed by a positive integer.\n";
    break;
  case 0x47:
    if (globalUtilOptind < argc) {
      local_c4 = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar3 + 1;
      local_5c = local_c4;
      goto LAB_003879f4;
    }
    pcVar5 = "Command line switch \"-G\" should be followed by a positive integer.\n";
    break;
  case 0x49:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      Pars.nIters = uVar2;
      local_68 = uVar2;
      goto LAB_00387bdc;
    }
    pcVar5 = "Command line switch \"-I\" should be followed by a positive integer.\n";
    break;
  case 0x4a:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      Pars.nIterNoChange = uVar2;
      local_64 = uVar2;
      goto LAB_00387bdc;
    }
    pcVar5 = "Command line switch \"-J\" should be followed by a positive integer.\n";
    break;
  case 0x4e:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      Pars.Notches = uVar2;
      local_50 = uVar2;
      goto LAB_00387bdc;
    }
    pcVar5 = "Command line switch \"-N\" should be followed by a positive integer.\n";
    break;
  case 0x52:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      Pars.Ratio = uVar2;
      local_58 = uVar2;
      goto LAB_00387bdc;
    }
    pcVar5 = "Command line switch \"-R\" should be followed by a positive integer.\n";
    break;
  case 0x54:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_c8 = uVar2;
      local_4c = uVar2;
      goto LAB_00387bdc;
    }
    pcVar5 = "Command line switch \"-T\" should be followed by a positive integer.\n";
    break;
  case 0x57:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      Pars.Window = uVar2;
      local_60 = uVar2;
      goto LAB_00387bdc;
    }
    pcVar5 = "Command line switch \"-W\" should be followed by a positive integer.\n";
    break;
  case 0x58:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_cc = uVar2;
      local_48 = uVar2;
      goto LAB_00387bdc;
    }
    pcVar5 = "Command line switch \"-X\" should be followed by a positive integer.\n";
    break;
  default:
    if (iVar1 == 99) {
      local_bc = local_bc ^ 1;
    }
    else if (iVar1 == 100) {
      local_78 = local_78 ^ 1;
    }
    else if (iVar1 == 0x73) {
      local_c0 = local_6c ^ 1;
      local_6c = local_c0;
    }
    else if (iVar1 == 0x76) {
      local_74 = local_74 ^ 1;
    }
    else {
      if (iVar1 != 0x77) {
        if (iVar1 == -1) {
          Pars.DelayGap = local_c4;
          Pars.fUseWireLoads = local_bc;
          Pars.fUseDept = local_c0;
          Pars.BypassFreq = local_d0;
          Pars.BuffTreeEst = local_cc;
          Pars.TimeOut = local_c8;
          Pars.fVeryVerbose = local_70;
          Pars.fVerbose = local_74;
          Pars.fDumpStats = local_78;
          pAVar4 = Abc_FrameReadNtk(pAbc);
          if (pAVar4 == (Abc_Ntk_t *)0x0) {
            __s = (FILE *)pAbc->Err;
            pcVar5 = "There is no current network.\n";
            sStack_e0 = 0x1d;
          }
          else {
            pAVar4 = Abc_FrameReadNtk(pAbc);
            if (pAVar4->ntkFunc == ABC_FUNC_MAP) {
              pAVar4 = Abc_FrameReadNtk(pAbc);
              iVar3 = Abc_SclCheckNtk(pAVar4,0);
              if (iVar3 != 0) {
                if ((pAbc->pLibScl != (void *)0x0) &&
                   (iVar3 = Abc_SclHasDelayInfo(pAbc->pLibScl), iVar3 != 0)) {
                  Abc_SclUpsizePerform((SC_Lib *)pAbc->pLibScl,pNtk,&Pars);
                  return 0;
                }
                Abc_Print(-1,"Library delay info is not available.\n");
                return 1;
              }
              __s = (FILE *)pAbc->Err;
              pcVar5 = "The current network is not in a topo order (run \"topo\").\n";
              sStack_e0 = 0x39;
            }
            else {
              __s = (FILE *)pAbc->Err;
              pcVar5 = "The current network is not mapped.\n";
              sStack_e0 = 0x23;
            }
          }
          goto LAB_00388152;
        }
        goto switchD_00387a12_caseD_43;
      }
      local_70 = local_70 ^ 1;
    }
    goto LAB_003879f4;
  }
  Pars.fUseDept = local_c0;
  Pars.BypassFreq = local_d0;
  Pars.BuffTreeEst = local_cc;
  Pars.TimeOut = local_c8;
  Pars.DelayGap = local_c4;
  Pars.fUseWireLoads = local_bc;
  Abc_Print(-1,pcVar5);
  goto LAB_00387f7a;
}

Assistant:

int Scl_CommandUpsize( Abc_Frame_t * pAbc, int argc, char **argv )
{
    SC_SizePars Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    memset( pPars, 0, sizeof(SC_SizePars) );
    pPars->nIters        = 1000;
    pPars->nIterNoChange =   50;
    pPars->Window        =    1;
    pPars->Ratio         =   10;
    pPars->Notches       = 1000;
    pPars->DelayUser     =    0;
    pPars->DelayGap      =    0;
    pPars->TimeOut       =    0;
    pPars->BuffTreeEst   =    0;
    pPars->BypassFreq    =    0;
    pPars->fUseDept      =    1;
    pPars->fUseWireLoads =    0;
    pPars->fDumpStats    =    0;
    pPars->fVerbose      =    0;
    pPars->fVeryVerbose  =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "IJWRNDGTXBcsdvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIters < 0 ) 
                goto usage;
            break;
        case 'J':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-J\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nIterNoChange = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIterNoChange < 0 ) 
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->Window = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Window < 0 ) 
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->Ratio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Ratio < 0 ) 
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->Notches = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Notches < 0 ) 
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->DelayUser = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->DelayUser < 0 ) 
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->DelayGap = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->TimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOut < 0 ) 
                goto usage;
            break;
        case 'X':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-X\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->BuffTreeEst = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->BuffTreeEst < 0 ) 
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->BypassFreq = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->BypassFreq < 0 ) 
                goto usage;
            break;
        case 'c':
            pPars->fUseWireLoads ^= 1;
            break;
        case 's':
            pPars->fUseDept ^= 1;
            break;
        case 'd':
            pPars->fDumpStats ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( Abc_FrameReadNtk(pAbc) == NULL )
    {
        fprintf( pAbc->Err, "There is no current network.\n" );
        return 1;
    }
    if ( !Abc_NtkHasMapping(Abc_FrameReadNtk(pAbc)) )
    {
        fprintf( pAbc->Err, "The current network is not mapped.\n" );
        return 1;
    }
    if ( !Abc_SclCheckNtk(Abc_FrameReadNtk(pAbc), 0) )
    {
        fprintf( pAbc->Err, "The current network is not in a topo order (run \"topo\").\n" );
        return 1;
    }
    if ( !pAbc->pLibScl || !Abc_SclHasDelayInfo(pAbc->pLibScl) )
    {
        Abc_Print( -1, "Library delay info is not available.\n" );
        return 1;
    }

    Abc_SclUpsizePerform( (SC_Lib *)pAbc->pLibScl, pNtk, pPars );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: upsize [-IJWRNDGTXB num] [-csdvwh]\n" );
    fprintf( pAbc->Err, "\t           selectively increases gate sizes on the critical path\n" );
    fprintf( pAbc->Err, "\t-I <num> : the number of upsizing iterations to perform [default = %d]\n", pPars->nIters );
    fprintf( pAbc->Err, "\t-J <num> : the number of iterations without improvement to stop [default = %d]\n", pPars->nIterNoChange );
    fprintf( pAbc->Err, "\t-W <num> : delay window (in percent) of near-critical COs [default = %d]\n", pPars->Window );
    fprintf( pAbc->Err, "\t-R <num> : ratio of critical nodes (in percent) to update [default = %d]\n", pPars->Ratio );
    fprintf( pAbc->Err, "\t-N <num> : limit on discrete upsizing steps at a node [default = %d]\n", pPars->Notches );
    fprintf( pAbc->Err, "\t-D <num> : delay target set by the user, in picoseconds [default = %d]\n", pPars->DelayUser );
    fprintf( pAbc->Err, "\t-G <num> : delay gap during updating, in picoseconds [default = %d]\n", pPars->DelayGap );
    fprintf( pAbc->Err, "\t-T <num> : approximate timeout in seconds [default = %d]\n", pPars->TimeOut );
    fprintf( pAbc->Err, "\t-X <num> : ratio for buffer tree estimation [default = %d]\n", pPars->BuffTreeEst );
    fprintf( pAbc->Err, "\t-B <num> : frequency of bypass transforms [default = %d]\n", pPars->BypassFreq );
    fprintf( pAbc->Err, "\t-c       : toggle using wire-loads if specified [default = %s]\n", pPars->fUseWireLoads? "yes": "no" );
    fprintf( pAbc->Err, "\t-s       : toggle using slack based on departure times [default = %s]\n", pPars->fUseDept? "yes": "no" );
    fprintf( pAbc->Err, "\t-d       : toggle dumping statistics into a file [default = %s]\n", pPars->fDumpStats? "yes": "no" );
    fprintf( pAbc->Err, "\t-v       : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-w       : toggle printing more verbose information [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h       : print the command usage\n");
    return 1;
}